

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagInfoDatabase.cpp
# Opt level: O0

string * __thiscall
TagInfoDatabase::toJson_abi_cxx11_(string *__return_storage_ptr__,TagInfoDatabase *this)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_220;
  string local_200;
  TagInfo local_1dc;
  reference ppStack_1d8;
  TagInfo tagInfo;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo>
  *pair;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo>_>_>
  *__range1;
  stringstream local_1a0 [7];
  bool first;
  stringstream json;
  ostream local_190 [376];
  TagInfoDatabase *local_18;
  TagInfoDatabase *this_local;
  
  local_18 = this;
  this_local = (TagInfoDatabase *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = true;
  std::operator<<(local_190,"{");
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo>_>_>
           ::begin(&this->_tagInformation);
  pair = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo>_>_>
            ::end(&this->_tagInformation);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&pair), bVar2) {
    ppStack_1d8 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo>_>
                  ::operator*(&__end1);
    local_1dc._count = (ppStack_1d8->second)._count;
    bVar2 = TagInfo::hasCount(&local_1dc);
    if (bVar2) {
      pcVar4 = ",";
      if (bVar1) {
        pcVar4 = "";
      }
      poVar3 = std::operator<<(local_190,pcVar4);
      poVar3 = std::operator<<(poVar3,"\n  \"");
      ::json::encode(&local_200,&ppStack_1d8->first);
      poVar3 = std::operator<<(poVar3,(string *)&local_200);
      poVar3 = std::operator<<(poVar3,"\":");
      TagInfo::toJson_abi_cxx11_(&local_220,&local_1dc);
      std::operator<<(poVar3,(string *)&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      bVar1 = false;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TagInfo>_>
    ::operator++(&__end1);
  }
  std::operator<<(local_190,"\n}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TagInfoDatabase::toJson ()
{
  std::stringstream json;
  bool first = true;

  json << "{";

  for (auto& pair : _tagInformation)
  {
    auto tagInfo = pair.second;

    if (tagInfo.hasCount ())
    {
      json << (first ? "" : ",")
         << "\n  \"" << json::encode (pair.first) << "\":"
         << tagInfo.toJson ();

      first = (first ? false : first);
    }
  }

  json << "\n}";

  return json.str ();
}